

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::ColorQuant::addColor(ColorQuant *this,RGBA color)

{
  uint32 addr;
  Node *pNVar1;
  
  addr = makeTreeAddr(color);
  pNVar1 = getNode(this,this->root,addr,8);
  pNVar1->r = pNVar1->r + ((uint)color & 0xff);
  pNVar1->g = pNVar1->g + ((uint)color >> 8 & 0xff);
  pNVar1->b = pNVar1->b + ((uint)color >> 0x10 & 0xff);
  pNVar1->a = pNVar1->a + ((uint)color >> 0x18);
  pNVar1->numPixels = pNVar1->numPixels + 1;
  return;
}

Assistant:

void
ColorQuant::addColor(RGBA color)
{
	uint32 addr = makeTreeAddr(color);
	ColorQuant::Node *node = this->getNode(root, addr, QUANTDEPTH);
	node->addColor(color);
}